

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O2

void __thiscall cab::add_request(cab *this,node_type src,node_type dst,uint32_t passengers)

{
  vector<request,_std::allocator<request>_> *this_00;
  road_network *prVar1;
  node_type nVar2;
  bool bVar3;
  node_type nVar4;
  bool bVar5;
  pair<bool,_bool> pVar6;
  uint32_t uVar7;
  uint uVar8;
  pointer prVar9;
  long lVar10;
  ulong uVar11;
  pointer prVar12;
  uint local_48;
  shared_ptr<cab_session> shared;
  
  this_00 = &this->_requests;
  lVar10 = 0;
  uVar11 = 0;
  while( true ) {
    prVar9 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
             super__Vector_impl_data._M_start;
    prVar12 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)prVar12 - (long)prVar9 >> 4) <= uVar11) break;
    nVar2 = request::src((request *)(&prVar9->_src + lVar10));
    if (nVar2 == src) {
      nVar2 = request::dst((request *)
                           (&((this_00->super__Vector_base<request,_std::allocator<request>_>).
                              _M_impl.super__Vector_impl_data._M_start)->_src + lVar10));
      if (nVar2 == dst) {
        request::add_passengers
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar10),passengers);
        return;
      }
    }
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x10;
  }
  pVar6 = route_contains_ordered(this,src,dst);
  lVar10 = 0;
  uVar11 = 0;
  local_48 = 0;
  do {
    if ((ulong)((long)prVar12 - (long)prVar9 >> 4) <= uVar11) {
      uVar8 = this->_costs;
      if (this->_costs < local_48) {
        uVar8 = local_48;
      }
      this->_costs = uVar8;
      request::request((request *)&shared,src,dst,passengers);
      std::vector<request,_std::allocator<request>_>::emplace_back<request>
                (this_00,(request *)&shared);
      std::__shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&shared.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>,
                 &this->_cab_session);
      if (shared.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        cab_session::send_request
                  (shared.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&shared.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    bVar3 = road_network::is_inner(this->_rnet,src);
    if (((ushort)pVar6 & 1) == 0) {
      prVar1 = this->_rnet;
      nVar2 = this->_position;
      nVar4 = request::src((request *)
                           (&((this->_requests).
                              super__Vector_base<request,_std::allocator<request>_>._M_impl.
                              super__Vector_impl_data._M_start)->_src + lVar10));
      bVar5 = road_network::in_between(prVar1,nVar2,nVar4,src);
      if (!bVar5) {
        prVar1 = this->_rnet;
        nVar2 = request::src((request *)
                             (&((this->_requests).
                                super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                super__Vector_impl_data._M_start)->_src + lVar10));
        nVar4 = request::dst((request *)
                             (&((this->_requests).
                                super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                super__Vector_impl_data._M_start)->_src + lVar10));
        bVar5 = road_network::in_between(prVar1,nVar2,nVar4,src);
        if (!bVar5) goto LAB_0011a5ba;
      }
      request::add_detours
                ((request *)
                 (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                    super__Vector_impl_data._M_start)->_src + lVar10),2 - bVar3);
    }
LAB_0011a5ba:
    bVar3 = road_network::is_inner(this->_rnet,dst);
    if (((ushort)pVar6 >> 8 & 1) == 0) {
      prVar1 = this->_rnet;
      nVar2 = this->_position;
      nVar4 = request::src((request *)
                           (&((this->_requests).
                              super__Vector_base<request,_std::allocator<request>_>._M_impl.
                              super__Vector_impl_data._M_start)->_src + lVar10));
      bVar5 = road_network::in_between(prVar1,nVar2,nVar4,dst);
      if (!bVar5) {
        prVar1 = this->_rnet;
        nVar2 = request::src((request *)
                             (&((this->_requests).
                                super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                super__Vector_impl_data._M_start)->_src + lVar10));
        nVar4 = request::dst((request *)
                             (&((this->_requests).
                                super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                super__Vector_impl_data._M_start)->_src + lVar10));
        bVar5 = road_network::in_between(prVar1,nVar2,nVar4,dst);
        if (!bVar5) goto LAB_0011a64b;
      }
      request::add_detours
                ((request *)
                 (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                    super__Vector_impl_data._M_start)->_src + lVar10),2 - bVar3);
    }
LAB_0011a64b:
    uVar7 = request::detours((request *)
                             (&((this_00->super__Vector_base<request,_std::allocator<request>_>).
                                _M_impl.super__Vector_impl_data._M_start)->_src + lVar10));
    if (local_48 < uVar7) {
      local_48 = request::detours((request *)
                                  (&((this_00->super__Vector_base<request,_std::allocator<request>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_src + lVar10));
    }
    uVar11 = uVar11 + 1;
    prVar9 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
             super__Vector_impl_data._M_start;
    prVar12 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

void cab::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == src && _requests[i].dst() == dst)
        {
            _requests[i].add_passengers(passengers);
            return;
        }
    }

    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    // add detours to all requests
    // does the sme as calculate costs
    std::uint32_t max = 0;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        bool is_inner = _rnet->is_inner(src); 
        if(!found_src && (_rnet->in_between(_position, _requests[i].src(), src) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), src)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }

        is_inner = _rnet->is_inner(dst); 
        if(!found_dst && (_rnet->in_between(_position, _requests[i].src(), dst) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), dst)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }
        
        max = _requests[i].detours() > max ? _requests[i].detours() : max;
    }
    _costs = max > _costs ? max : _costs; 

    _requests.push_back(request(src, dst, passengers));

    // inform external controller
    if(auto shared = _cab_session.lock())
    {
        shared->send_request(_requests.back());
    }
}